

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

int luaH_psetstr(Table *t,TString *key,TValue *val)

{
  int iVar1;
  TValue *io1;
  TValue *pTVar2;
  TValue *io;
  TValue *io2;
  Value local_28;
  byte local_20;
  
  if (-1 < key->shrlen) {
    iVar1 = luaH_psetshortstr(t,key,val);
    return iVar1;
  }
  local_20 = key->tt | 0x40;
  iVar1 = 0;
  local_28 = (Value)key;
  pTVar2 = getgeneric(t,(TValue *)&local_28,0);
  if ((pTVar2->tt_ & 0xf) == 0) {
    iVar1 = 1;
    if (pTVar2->tt_ != 0x20) {
      iVar1 = (int)((ulong)((long)pTVar2 - (long)t->node) >> 3) * -0x55555555 + 3;
    }
  }
  else {
    pTVar2->value_ = val->value_;
    pTVar2->tt_ = val->tt_;
  }
  return iVar1;
}

Assistant:

int luaH_psetstr (Table *t, TString *key, TValue *val) {
  if (strisshr(key))
    return luaH_psetshortstr(t, key, val);
  else
    return finishnodeset(t, Hgetlongstr(t, key), val);
}